

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapInsertBlobKey(jx9_hashmap *pMap,void *pKey,sxu32 nKeyLen,jx9_value *pValue)

{
  sxi32 sVar1;
  sxu32 local_48;
  sxi32 rc;
  sxu32 nIdx;
  sxu32 nHash;
  jx9_value *pObj;
  jx9_hashmap_node *pNode;
  jx9_value *pValue_local;
  void *pvStack_20;
  sxu32 nKeyLen_local;
  void *pKey_local;
  jx9_hashmap *pMap_local;
  
  pNode = (jx9_hashmap_node *)pValue;
  pValue_local._4_4_ = nKeyLen;
  pvStack_20 = pKey;
  pKey_local = pMap;
  _nIdx = jx9VmReserveMemObj(pMap->pVm,&local_48);
  if (_nIdx == (jx9_value *)0x0) {
    pMap_local._4_4_ = -1;
  }
  else {
    if (pNode != (jx9_hashmap_node *)0x0) {
      jx9MemObjStore((jx9_value *)pNode,_nIdx);
    }
    rc = (**(code **)((long)pKey_local + 0x38))(pvStack_20,pValue_local._4_4_);
    pObj = (jx9_value *)
           HashmapNewBlobNode((jx9_hashmap *)pKey_local,pvStack_20,pValue_local._4_4_,rc,local_48);
    if ((jx9_hashmap_node *)pObj == (jx9_hashmap_node *)0x0) {
      pMap_local._4_4_ = -1;
    }
    else {
      sVar1 = HashmapGrowBucket((jx9_hashmap *)pKey_local);
      if (sVar1 == 0) {
        HashmapNodeLink((jx9_hashmap *)pKey_local,(jx9_hashmap_node *)pObj,
                        rc & *(int *)((long)pKey_local + 0x28) - 1U);
        pMap_local._4_4_ = 0;
      }
      else {
        SyMemBackendPoolFree(*pKey_local,pObj);
        pMap_local._4_4_ = sVar1;
      }
    }
  }
  return pMap_local._4_4_;
}

Assistant:

static sxi32 HashmapInsertBlobKey(jx9_hashmap *pMap,const void *pKey,sxu32 nKeyLen,jx9_value *pValue)
{
	jx9_hashmap_node *pNode;
	jx9_value *pObj;
	sxu32 nHash;
	sxu32 nIdx;
	sxi32 rc;
	/* Reserve a jx9_value for the value */
	pObj = jx9VmReserveMemObj(pMap->pVm,&nIdx);
	if( pObj == 0 ){
		return SXERR_MEM;
	}
	if( pValue ){
		/* Duplicate the value */
		jx9MemObjStore(pValue, pObj);
	}
	/* Hash the key */
	nHash = pMap->xBlobHash(pKey, nKeyLen);
	/* Allocate a new blob node */
	pNode = HashmapNewBlobNode(&(*pMap), pKey, nKeyLen, nHash, nIdx);
	if( pNode == 0 ){
		return SXERR_MEM;
	}
	/* Make sure the bucket is big enough to hold the new entry */
	rc = HashmapGrowBucket(&(*pMap));
	if( rc != SXRET_OK ){
		SyMemBackendPoolFree(&pMap->pVm->sAllocator, pNode);
		return rc;
	}
	/* Perform the insertion */
	HashmapNodeLink(&(*pMap), pNode, nHash & (pMap->nSize - 1));
	/* All done */
	return SXRET_OK;
}